

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

void sznet::sz_localtime(tm *t,time_t n)

{
  time_t local_20;
  time_t lt;
  time_t n_local;
  tm *t_local;
  
  local_20 = n;
  lt = n;
  n_local = (time_t)t;
  if (n == -1) {
    local_20 = time((time_t *)0x0);
  }
  localtime_r(&local_20,(tm *)n_local);
  return;
}

Assistant:

void sz_localtime(struct tm& t, time_t n)
{
	time_t lt;
	if (n == -1)
	{
		lt = time(nullptr);
	}
	else
	{
		lt = n;
	}
#if SZ_OS_LINUX
	localtime_r(&lt, &t);
#else
	t = *(localtime(&lt));
#endif
}